

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_path_unittest.cc
# Opt level: O2

string * AppendPID(string *__return_storage_ptr__,string *str)

{
  __pid_t __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  std::operator+(&local_50,str,"_");
  __val = getpid();
  std::__cxx11::to_string(&local_30,__val);
  std::operator+(__return_storage_ptr__,&local_50,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string AppendPID(const std::string &str) {
  return str + "_" + std::to_string(getpid());
}